

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O1

GLFWwindow *
glfwCreateWindow(int width,int height,char *title,GLFWmonitor *monitor,GLFWwindow *share)

{
  GLFWbool GVar1;
  int iVar2;
  _GLFWwindow *window;
  _GLFWwindow *handle;
  long lVar3;
  _GLFWlibrary *p_Var4;
  _GLFWfbconfig *p_Var5;
  _GLFWwndconfig wndconfig;
  _GLFWctxconfig ctxconfig;
  _GLFWfbconfig fbconfig;
  _GLFWwndconfig local_d8;
  _GLFWctxconfig local_a8;
  _GLFWfbconfig local_70;
  
  if (title == (char *)0x0) {
    __assert_fail("title != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mankeywitz[P]opengl-compute-example/deps/glfw-3.2.1/src/window.c"
                  ,0x82,
                  "GLFWwindow *glfwCreateWindow(int, int, const char *, GLFWmonitor *, GLFWwindow *)"
                 );
  }
  if (_glfwInitialized == 0) {
    iVar2 = 0x10001;
  }
  else {
    if (width < 1 || height < 1) {
      _glfwInputError(0x10004,"Invalid window size %ix%i",(ulong)(uint)width,height);
      return (GLFWwindow *)0x0;
    }
    p_Var4 = &_glfw;
    p_Var5 = &local_70;
    for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
      iVar2 = (p_Var4->hints).framebuffer.greenBits;
      p_Var5->redBits = (p_Var4->hints).framebuffer.redBits;
      p_Var5->greenBits = iVar2;
      p_Var4 = (_GLFWlibrary *)&(p_Var4->hints).framebuffer.blueBits;
      p_Var5 = (_GLFWfbconfig *)&p_Var5->blueBits;
    }
    local_a8._32_8_ = _glfw.hints.context._32_8_;
    local_a8._16_8_ = _glfw.hints.context._16_8_;
    local_a8._24_8_ = _glfw.hints.context._24_8_;
    local_a8._0_8_ = _glfw.hints.context._0_8_;
    local_a8._8_8_ = _glfw.hints.context._8_8_;
    local_d8._16_8_ = _glfw.hints.window._16_8_;
    local_d8._24_8_ = _glfw.hints.window._24_8_;
    local_d8._32_8_ = _glfw.hints.window._32_8_;
    local_d8._40_8_ = _glfw.hints.window._40_8_;
    local_d8.height = height;
    local_d8.width = width;
    local_d8.title = title;
    local_a8.share = (_GLFWwindow *)share;
    if ((share == (GLFWwindow *)0x0) ||
       ((local_a8.client = _glfw.hints.context.client, local_a8.client != 0 &&
        (*(int *)(share + 0x1f0) != 0)))) {
      GVar1 = _glfwIsValidContextConfig(&local_a8);
      if (GVar1 != 0) {
        window = (_GLFWwindow *)calloc(1,0x358);
        window->next = _glfw.windowListHead;
        _glfw.windowListHead = window;
        (window->videoMode).width = width;
        (window->videoMode).height = height;
        (window->videoMode).redBits = local_70.redBits;
        (window->videoMode).greenBits = local_70.greenBits;
        (window->videoMode).blueBits = local_70.blueBits;
        (window->videoMode).refreshRate = _glfw.hints.refreshRate;
        window->monitor = (_GLFWmonitor *)monitor;
        window->resizable = local_d8.resizable;
        window->decorated = local_d8.decorated;
        window->autoIconify = local_d8.autoIconify;
        window->floating = local_d8.floating;
        window->cursorMode = 0x34001;
        window->minwidth = -1;
        window->minheight = -1;
        window->maxwidth = -1;
        window->maxheight = -1;
        window->numer = -1;
        window->denom = -1;
        handle = _glfwPlatformGetCurrentContext();
        if (local_a8.client != 0) {
          glfwMakeContextCurrent((GLFWwindow *)0x0);
        }
        iVar2 = _glfwPlatformCreateWindow(window,&local_d8,&local_a8,&local_70);
        if (iVar2 == 0) {
          glfwMakeContextCurrent((GLFWwindow *)handle);
        }
        else {
          if (local_a8.client == 0) {
LAB_0010b903:
            if (window->monitor != (_GLFWmonitor *)0x0) {
              return (GLFWwindow *)window;
            }
            if (local_d8.visible == 0) {
              return (GLFWwindow *)window;
            }
            _glfwPlatformShowWindow(window);
            if (local_d8.focused == 0) {
              return (GLFWwindow *)window;
            }
            _glfwPlatformFocusWindow(window);
            return (GLFWwindow *)window;
          }
          (*(window->context).makeCurrent)(window);
          GVar1 = _glfwRefreshContextAttribs(&local_a8);
          glfwMakeContextCurrent((GLFWwindow *)handle);
          if (GVar1 != 0) goto LAB_0010b903;
        }
        glfwDestroyWindow((GLFWwindow *)window);
      }
      return (GLFWwindow *)0x0;
    }
    iVar2 = 0x1000a;
  }
  _glfwInputError(iVar2,(char *)0x0);
  return (GLFWwindow *)0x0;
}

Assistant:

GLFWAPI GLFWwindow* glfwCreateWindow(int width, int height,
                                     const char* title,
                                     GLFWmonitor* monitor,
                                     GLFWwindow* share)
{
    _GLFWfbconfig fbconfig;
    _GLFWctxconfig ctxconfig;
    _GLFWwndconfig wndconfig;
    _GLFWwindow* window;
    _GLFWwindow* previous;

    assert(title != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (width <= 0 || height <= 0)
    {
        _glfwInputError(GLFW_INVALID_VALUE,
                        "Invalid window size %ix%i",
                        width, height);

        return NULL;
    }

    fbconfig  = _glfw.hints.framebuffer;
    ctxconfig = _glfw.hints.context;
    wndconfig = _glfw.hints.window;

    wndconfig.width   = width;
    wndconfig.height  = height;
    wndconfig.title   = title;
    ctxconfig.share   = (_GLFWwindow*) share;

    if (ctxconfig.share)
    {
        if (ctxconfig.client == GLFW_NO_API ||
            ctxconfig.share->context.client == GLFW_NO_API)
        {
            _glfwInputError(GLFW_NO_WINDOW_CONTEXT, NULL);
            return NULL;
        }
    }

    if (!_glfwIsValidContextConfig(&ctxconfig))
        return NULL;

    window = calloc(1, sizeof(_GLFWwindow));
    window->next = _glfw.windowListHead;
    _glfw.windowListHead = window;

    window->videoMode.width       = width;
    window->videoMode.height      = height;
    window->videoMode.redBits     = fbconfig.redBits;
    window->videoMode.greenBits   = fbconfig.greenBits;
    window->videoMode.blueBits    = fbconfig.blueBits;
    window->videoMode.refreshRate = _glfw.hints.refreshRate;

    window->monitor     = (_GLFWmonitor*) monitor;
    window->resizable   = wndconfig.resizable;
    window->decorated   = wndconfig.decorated;
    window->autoIconify = wndconfig.autoIconify;
    window->floating    = wndconfig.floating;
    window->cursorMode  = GLFW_CURSOR_NORMAL;

    window->minwidth    = GLFW_DONT_CARE;
    window->minheight   = GLFW_DONT_CARE;
    window->maxwidth    = GLFW_DONT_CARE;
    window->maxheight   = GLFW_DONT_CARE;
    window->numer       = GLFW_DONT_CARE;
    window->denom       = GLFW_DONT_CARE;

    // Save the currently current context so it can be restored later
    previous = _glfwPlatformGetCurrentContext();
    if (ctxconfig.client != GLFW_NO_API)
        glfwMakeContextCurrent(NULL);

    // Open the actual window and create its context
    if (!_glfwPlatformCreateWindow(window, &wndconfig, &ctxconfig, &fbconfig))
    {
        glfwMakeContextCurrent((GLFWwindow*) previous);
        glfwDestroyWindow((GLFWwindow*) window);
        return NULL;
    }

    if (ctxconfig.client != GLFW_NO_API)
    {
        window->context.makeCurrent(window);

        // Retrieve the actual (as opposed to requested) context attributes
        if (!_glfwRefreshContextAttribs(&ctxconfig))
        {
            glfwMakeContextCurrent((GLFWwindow*) previous);
            glfwDestroyWindow((GLFWwindow*) window);
            return NULL;
        }

        // Restore the previously current context (or NULL)
        glfwMakeContextCurrent((GLFWwindow*) previous);
    }

    if (!window->monitor)
    {
        if (wndconfig.visible)
        {
            _glfwPlatformShowWindow(window);
            if (wndconfig.focused)
                _glfwPlatformFocusWindow(window);
        }
    }

    return (GLFWwindow*) window;
}